

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O1

void hwnet::http::HttpSession::onData(Ptr *ss,Ptr *buff,size_t n)

{
  _func_int **pp_Var1;
  element_type *peVar2;
  char *pcVar3;
  any *paVar4;
  size_t sVar5;
  size_t sVar6;
  char *__s;
  
  paVar4 = TCPSocket::GetUserData
                     ((ss->super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  pp_Var1 = paVar4->content[1]._vptr_placeholder;
  peVar2 = (buff->super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pcVar3 = ((peVar2->buff).super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->ptr;
  __s = pcVar3 + peVar2->b;
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x131200);
  }
  else {
    sVar5 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar5);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  sVar6 = http_parser_execute((http_parser *)(pp_Var1 + 2),(http_parser_settings *)(pp_Var1 + 6),__s
                              ,n);
  if (sVar6 != n) {
    TCPSocket::Close((ss->super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  }
  TCPSocket::Recv((TCPSocket *)pp_Var1[0xe],(Ptr *)(pp_Var1 + 0x10));
  return;
}

Assistant:

void HttpSession::onData(const TCPSocket::Ptr &ss,const Buffer::Ptr &buff,size_t n) {
	auto session = any_cast<HttpSession*>(ss->GetUserData());
	auto ptr = buff->BuffPtr();
	std::cout << ptr << std::endl;
	auto nparsed = http_parser_execute(&session->parser,&session->settings,ptr,n);
	if(nparsed != n) {
		onError(ss,0);
	}
	session->Recv();
}